

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O0

void CGL::Misc::draw_sphere_opengl(Vector3D *p,double r,Color *c)

{
  char cVar1;
  undefined4 *in_RSI;
  GLfloat temp [3];
  double in_stack_000000c8;
  Vector3D *in_stack_000000d0;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_24 = *in_RSI;
  local_20 = in_RSI[1];
  local_1c = in_RSI[2];
  cVar1 = glIsEnabled(0xb50);
  if (cVar1 == '\0') {
    glColor3fv(&local_24);
    draw_sphere(in_stack_000000d0,in_stack_000000c8);
  }
  else {
    glDisable(0xb50);
    glColor3fv(&local_24);
    draw_sphere(in_stack_000000d0,in_stack_000000c8);
    glEnable(0xb50);
  }
  return;
}

Assistant:

void draw_sphere_opengl(const Vector3D& p, double r, const Color& c) {
  GLfloat temp[3];
  temp[0] = c.r;
  temp[1] = c.g;
  temp[2] = c.b;

  if (glIsEnabled(GL_LIGHTING)) {
    glDisable(GL_LIGHTING);
    glColor3fv(temp);
    draw_sphere(p, r);
    glEnable(GL_LIGHTING);
  } else {
    glColor3fv(temp);
    draw_sphere(p, r);
  }
}